

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

void mp_gcd_into(mp_int *a,mp_int *b,mp_int *gcd,mp_int *A,mp_int *B)

{
  ulong uVar1;
  BignumInt *pBVar2;
  mp_int *pmVar3;
  size_t sVar4;
  mp_int *r;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  BignumInt BVar8;
  ulong uVar9;
  BignumInt BVar10;
  
  uVar6 = b->nw;
  if (b->nw < a->nw) {
    uVar6 = a->nw;
  }
  pmVar3 = mp_make_sized(uVar6);
  sVar4 = pmVar3->nw;
  if (sVar4 != 0) {
    uVar6 = a->nw;
    uVar1 = b->nw;
    pBVar2 = pmVar3->w;
    uVar7 = 0;
    do {
      if (uVar7 < uVar6) {
        BVar8 = a->w[uVar7];
      }
      else {
        BVar8 = 0;
      }
      if (uVar7 < uVar1) {
        BVar10 = b->w[uVar7];
      }
      else {
        BVar10 = 0;
      }
      pBVar2[uVar7] = BVar10 | BVar8;
      uVar7 = uVar7 + 1;
    } while (sVar4 != uVar7);
    pBVar2 = pmVar3->w;
    uVar6 = 1;
    sVar5 = 0;
    do {
      uVar1 = pBVar2[sVar5];
      uVar7 = ~uVar1;
      uVar9 = uVar7 + uVar6;
      uVar6 = (ulong)CARRY8(uVar7,uVar6);
      pBVar2[sVar5] = uVar9 & uVar1;
      sVar5 = sVar5 + 1;
    } while (sVar4 != sVar5);
  }
  sVar4 = mp_get_nbits(pmVar3);
  sVar4 = sVar4 - 1;
  mp_free(pmVar3);
  pBVar2 = a->w;
  pmVar3 = mp_make_sized(a->nw);
  memcpy(pmVar3->w,pBVar2,pmVar3->nw << 3);
  mp_rshift_safe_in_place(pmVar3,sVar4);
  pBVar2 = b->w;
  r = mp_make_sized(b->nw);
  memcpy(r->w,pBVar2,r->nw << 3);
  mp_rshift_safe_in_place(r,sVar4);
  mp_bezout_into(A,B,gcd,pmVar3,r);
  mp_free(pmVar3);
  mp_free(r);
  if (gcd != (mp_int *)0x0) {
    mp_lshift_safe_in_place(gcd,sVar4);
    return;
  }
  return;
}

Assistant:

void mp_gcd_into(mp_int *a, mp_int *b, mp_int *gcd, mp_int *A, mp_int *B)
{
    /*
     * Identify shared factors of 2. To do this we OR the two numbers
     * to get something whose lowest set bit is in the right place,
     * remove all higher bits by ANDing it with its own negation, and
     * use mp_get_nbits to find the location of the single remaining
     * set bit.
     */
    mp_int *tmp = mp_make_sized(size_t_max(a->nw, b->nw));
    for (size_t i = 0; i < tmp->nw; i++)
        tmp->w[i] = mp_word(a, i) | mp_word(b, i);
    BignumCarry carry = 1;
    for (size_t i = 0; i < tmp->nw; i++) {
        BignumInt negw;
        BignumADC(negw, carry, 0, ~tmp->w[i], carry);
        tmp->w[i] &= negw;
    }
    size_t shift = mp_get_nbits(tmp) - 1;
    mp_free(tmp);

    /*
     * Make copies of a,b with those shared factors of 2 divided off,
     * so that at least one is odd (which is the precondition for
     * mp_bezout_into). Compute the gcd of those.
     */
    mp_int *as = mp_rshift_safe(a, shift);
    mp_int *bs = mp_rshift_safe(b, shift);
    mp_bezout_into(A, B, gcd, as, bs);
    mp_free(as);
    mp_free(bs);

    /*
     * And finally shift the gcd back up (unless the caller didn't
     * even ask for it), to put the shared factors of 2 back in.
     */
    if (gcd)
        mp_lshift_safe_in_place(gcd, shift);
}